

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_optTests.cpp
# Opt level: O0

void __thiscall
shared_guarded_opt_shared_guarded_2_Test::~shared_guarded_opt_shared_guarded_2_Test
          (shared_guarded_opt_shared_guarded_2_Test *this)

{
  shared_guarded_opt_shared_guarded_2_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(shared_guarded_opt, shared_guarded_2)
{
    shared_guarded_opt<int, shared_mutex> data(true, 0);

    std::thread th1([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th3([&data]() {
        int last_val = 0;
        while (last_val != 200000) {
            auto data_handle = data.lock_shared();
            EXPECT_TRUE(last_val <= *data_handle);
            last_val = *data_handle;
        }
    });

    th1.join();
    th2.join();
    th3.join();

    auto data_handle = data.lock();

    EXPECT_EQ(*data_handle, 200000);
}